

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
               (int field_number,string *value,CodedOutputStream *output)

{
  CodedOutputStream *pCVar1;
  uint32 uVar2;
  int size;
  ulong uVar3;
  LogMessage *other;
  void *data;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  CodedOutputStream *local_30;
  CodedOutputStream *output_local;
  string *value_local;
  CodedOutputStream *pCStack_18;
  int field_number_local;
  undefined4 local_10;
  int local_c;
  
  local_10 = 2;
  local_30 = output;
  output_local = (CodedOutputStream *)value;
  value_local._4_4_ = field_number;
  pCStack_18 = output;
  local_c = field_number;
  uVar2 = MakeTag(field_number,WIRETYPE_LENGTH_DELIMITED);
  io::CodedOutputStream::WriteTag(output,uVar2);
  uVar3 = std::__cxx11::string::size();
  local_69 = 0;
  if (0x7fffffff < uVar3) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/wire_format_lite.cc",0x1eb);
    local_69 = 1;
    other = LogMessage::operator<<(&local_68,"CHECK failed: (value.size()) <= (kint32max): ");
    LogFinisher::operator=(local_7d,other);
  }
  if ((local_69 & 1) != 0) {
    LogMessage::~LogMessage(&local_68);
  }
  pCVar1 = local_30;
  uVar2 = std::__cxx11::string::size();
  io::CodedOutputStream::WriteVarint32(pCVar1,uVar2);
  pCVar1 = local_30;
  data = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  io::CodedOutputStream::WriteRawMaybeAliased(pCVar1,data,size);
  return;
}

Assistant:

void WireFormatLite::WriteStringMaybeAliased(int field_number,
                                             const std::string& value,
                                             io::CodedOutputStream* output) {
  // String is for UTF-8 text only
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kint32max);
  output->WriteVarint32(value.size());
  output->WriteRawMaybeAliased(value.data(), value.size());
}